

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_assert.h
# Opt level: O0

void TestEq<int,int>(int expval,int val,char *file,int line,char *func)

{
  char *expval_00;
  char *val_00;
  string local_388 [32];
  string local_368 [32];
  stringstream local_348 [8];
  stringstream ss2;
  ostream local_338 [392];
  stringstream local_1b0 [8];
  stringstream ss1;
  ostream local_1a0 [376];
  char *local_28;
  char *func_local;
  char *pcStack_18;
  int line_local;
  char *file_local;
  int val_local;
  int expval_local;
  
  if (expval == val) {
    testing_success = testing_success + 1;
  }
  else {
    local_28 = func;
    func_local._4_4_ = line;
    pcStack_18 = file;
    file_local._0_4_ = val;
    file_local._4_4_ = expval;
    std::__cxx11::stringstream::stringstream(local_1b0);
    std::ostream::operator<<(local_1a0,file_local._4_4_);
    std::__cxx11::stringstream::stringstream(local_348);
    std::ostream::operator<<(local_338,(int)file_local);
    std::__cxx11::stringstream::str();
    expval_00 = (char *)std::__cxx11::string::c_str();
    std::__cxx11::stringstream::str();
    val_00 = (char *)std::__cxx11::string::c_str();
    TestFail(expval_00,val_00,pcStack_18,func_local._4_4_,local_28);
    std::__cxx11::string::~string(local_388);
    std::__cxx11::string::~string(local_368);
    std::__cxx11::stringstream::~stringstream(local_348);
    std::__cxx11::stringstream::~stringstream(local_1b0);
  }
  return;
}

Assistant:

void TestEq(T expval, U val, const char *file, int line, const char *func = 0)
  {
  if (U(expval) != val)
    {
    std::stringstream ss1;
    ss1 << expval;
    std::stringstream ss2;
    ss2 << val;
    TestFail(ss1.str().c_str(), ss2.str().c_str(), file, line, func);
    }
  else
    ++testing_success;
  }